

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

int __thiscall
CTcPrsNode::gen_code_asi
          (CTcPrsNode *this,int param_1,int phase,tc_asitype_t param_3,char *param_4,
          CTcPrsNode *param_5,int ignore_error,int param_7,void **param_8)

{
  if (1 < phase || ignore_error != 0) {
    return 0;
  }
  CTcTokenizer::throw_internal_error(0x3a9e);
}

Assistant:

int CTcPrsNode::gen_code_asi(int, int phase, tc_asitype_t, const char *,
                             CTcPrsNode *,
                             int ignore_error, int, void **)
{
    /* 
     *   If ignoring errors, the caller is trying to assign if possible but
     *   doesn't require it to be possible; simply return false to indicate
     *   that nothing happened if this is the case.  Also ignore errors on
     *   phase 2, since we'll already have reported an error on phase 1.  
     */
    if (ignore_error || phase > 1)
        return FALSE;
    
    /* we should never get here - throw an internal error */
    G_tok->throw_internal_error(TCERR_GEN_BAD_LVALUE);
    AFTER_ERR_THROW(return FALSE;)
}